

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthTests.cpp
# Opt level: O2

int __thiscall deqp::gles2::Functional::DepthTests::init(DepthTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  DepthCompareCase *pDVar1;
  
  pDVar1 = (DepthCompareCase *)operator_new(0x80);
  DepthCompareCase::DepthCompareCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"cmp_always","Always pass depth test",
             0x207);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DepthCompareCase *)operator_new(0x80);
  DepthCompareCase::DepthCompareCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"cmp_never","Never pass depth test",0x200)
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DepthCompareCase *)operator_new(0x80);
  DepthCompareCase::DepthCompareCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"cmp_equal","Depth compare: equal",0x202);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DepthCompareCase *)operator_new(0x80);
  DepthCompareCase::DepthCompareCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"cmp_not_equal","Depth compare: not equal"
             ,0x205);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DepthCompareCase *)operator_new(0x80);
  DepthCompareCase::DepthCompareCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"cmp_less_than","Depth compare: less than"
             ,0x201);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DepthCompareCase *)operator_new(0x80);
  DepthCompareCase::DepthCompareCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"cmp_less_or_equal",
             "Depth compare: less than or equal",0x203);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DepthCompareCase *)operator_new(0x80);
  DepthCompareCase::DepthCompareCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"cmp_greater_than",
             "Depth compare: greater than",0x204);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DepthCompareCase *)operator_new(0x80);
  DepthCompareCase::DepthCompareCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"cmp_greater_or_equal",
             "Depth compare: greater than or equal",0x206);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  return extraout_EAX;
}

Assistant:

void DepthTests::init (void)
{
	addChild(new DepthCompareCase(m_context, "cmp_always",				"Always pass depth test",				GL_ALWAYS));
	addChild(new DepthCompareCase(m_context, "cmp_never",				"Never pass depth test",				GL_NEVER));
	addChild(new DepthCompareCase(m_context, "cmp_equal",				"Depth compare: equal",					GL_EQUAL));
	addChild(new DepthCompareCase(m_context, "cmp_not_equal",			"Depth compare: not equal",				GL_NOTEQUAL));
	addChild(new DepthCompareCase(m_context, "cmp_less_than",			"Depth compare: less than",				GL_LESS));
	addChild(new DepthCompareCase(m_context, "cmp_less_or_equal",		"Depth compare: less than or equal",	GL_LEQUAL));
	addChild(new DepthCompareCase(m_context, "cmp_greater_than",		"Depth compare: greater than",			GL_GREATER));
	addChild(new DepthCompareCase(m_context, "cmp_greater_or_equal",	"Depth compare: greater than or equal",	GL_GEQUAL));
}